

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O3

void __thiscall xray_re::xr_scene_wallmarks::load(xr_scene_wallmarks *this,xr_reader *r)

{
  float *pfVar1;
  size_t sVar2;
  xr_reader *pxVar3;
  uint32_t id;
  uint16_t version;
  xr_reader *s;
  short local_54;
  read_slot_1 local_51;
  wm_slot_le *local_50;
  xr_reader *local_48;
  xr_reader *local_40;
  wm_slot_le *local_38;
  
  xr_scene_revision::load(&(this->super_xr_scene_part).m_revision,r);
  sVar2 = xr_reader::r_raw_chunk(r,1,&local_54,2);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_wallmarks.cxx"
                  ,0x34,"virtual void xray_re::xr_scene_wallmarks::load(xr_reader &)");
  }
  if (local_54 != 3) {
    __assert_fail("version == WALLMARK_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_wallmarks.cxx"
                  ,0x35,"virtual void xray_re::xr_scene_wallmarks::load(xr_reader &)");
  }
  sVar2 = xr_reader::find_chunk(r,3);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_wallmarks.cxx"
                  ,0x38,"virtual void xray_re::xr_scene_wallmarks::load(xr_reader &)");
  }
  pfVar1 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  this->m_width = *pfVar1;
  pfVar1 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  this->m_height = *pfVar1;
  pfVar1 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  this->m_rotate = *pfVar1;
  xr_reader::r_sz(r,&this->m_shader);
  xr_reader::r_sz(r,&this->m_texture);
  pxVar3 = xr_reader::open_chunk(r,5);
  local_48 = pxVar3;
  if (pxVar3 == (xr_reader *)0x0) {
    local_48 = xr_reader::open_chunk(r,4);
    if (local_48 == (xr_reader *)0x0) {
      return;
    }
    pxVar3 = xr_reader::open_chunk(local_48,0);
    if (pxVar3 != (xr_reader *)0x0) {
      local_50 = (wm_slot_le *)0x0;
      std::vector<xray_re::wm_slot_le*,std::allocator<xray_re::wm_slot_le*>>::
      emplace_back<xray_re::wm_slot_le*>
                ((vector<xray_re::wm_slot_le*,std::allocator<xray_re::wm_slot_le*>> *)&this->m_slots
                 ,&local_50);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_wallmarks.cxx"
                    ,0x2b,"void read_slot_0::operator()(wm_slot_le *&, xr_reader &) const");
    }
  }
  else {
    local_40 = r;
    local_50 = (wm_slot_le *)xr_reader::open_chunk(pxVar3,0);
    r = local_40;
    if (local_50 != (wm_slot_le *)0x0) {
      id = 1;
      do {
        local_38 = (wm_slot_le *)0x0;
        std::vector<xray_re::wm_slot_le*,std::allocator<xray_re::wm_slot_le*>>::
        emplace_back<xray_re::wm_slot_le*>
                  ((vector<xray_re::wm_slot_le*,std::allocator<xray_re::wm_slot_le*>> *)
                   &this->m_slots,&local_38);
        read_slot_1::operator()
                  (&local_51,
                   (this->m_slots).
                   super__Vector_base<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1,(xr_reader *)local_50);
        xr_reader::close_chunk(pxVar3,(xr_reader **)&local_50);
        local_50 = (wm_slot_le *)xr_reader::open_chunk(pxVar3,id);
        id = id + 1;
        r = local_40;
      } while (local_50 != (wm_slot_le *)0x0);
    }
  }
  xr_reader::close_chunk(r,&local_48);
  return;
}

Assistant:

void xr_scene_wallmarks::load(xr_reader& r)
{
	revision().load(r);

	uint16_t version;
	if (!r.r_chunk<uint16_t>(WM_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == WALLMARK_VERSION);

	if (!r.find_chunk(WM_CHUNK_PARAMS))
		xr_not_expected();
	m_width = r.r_float();
	m_height = r.r_float();
	m_rotate = r.r_float();
	r.r_sz(m_shader);
	r.r_sz(m_texture);
	r.debug_find_chunk();

	xr_reader* s;
	if ((s = r.open_chunk(WM_CHUNK_WALLMARKS_1))) {
		s->r_chunks(m_slots, read_slot_1());
		r.close_chunk(s);
	} else if ((s = r.open_chunk(WM_CHUNK_WALLMARKS_0))) {
		s->r_chunks(m_slots, read_slot_0());
		r.close_chunk(s);
	}
}